

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O1

void printPrimalSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,NameSet *colnames,NameSet *rownames,bool real,bool rational)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte bVar3;
  Verbosity VVar4;
  Tolerances *pTVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ostream *poVar7;
  ostream **ppoVar8;
  char cVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  size_t sVar13;
  undefined7 in_register_00000009;
  long lVar14;
  Verbosity old_verbosity;
  Verbosity VVar15;
  uint *puVar16;
  uint *puVar17;
  uint *puVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  char *pcVar24;
  Verbosity old_verbosity_1;
  int iVar25;
  byte bVar26;
  Real RVar27;
  double dVar28;
  Verbosity old_verbosity_3;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  primal;
  VectorRational primal_1;
  fpclass_type local_3f8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_3d0;
  long local_3b8;
  long local_3b0;
  data_type local_3a8;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [13];
  undefined3 uStack_33b;
  undefined5 uStack_338;
  undefined8 local_330;
  long local_320;
  cpp_dec_float<200U,_int,_void> local_318;
  data_type local_298;
  char local_283;
  char local_282;
  uint local_278;
  void *local_270;
  char local_263;
  char local_262;
  data_type local_258;
  char local_243;
  char local_242;
  uint local_238;
  void *local_230;
  char local_223;
  char local_222;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_210;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_190;
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar26 = 0;
  local_3b0 = CONCAT44(local_3b0._4_4_,(int)CONCAT71(in_register_00000009,real));
  pTVar5 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var6 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  RVar27 = ::soplex::Tolerances::epsilon(pTVar5);
  dVar28 = log10(RVar27);
  iVar21 = (int)-dVar28;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  iVar25 = iVar21 + 10;
  if ((char)rownames != '\0') {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase(&local_3d0,
                 (soplex->_realLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    bVar10 = ::soplex::
             SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::getPrimalRay(soplex,&local_3d0);
    if (bVar10) {
      VVar15 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar15) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nPrimal ray (name, value):\n",0x1b);
        (soplex->spxout).m_verbosity = VVar15;
      }
      if (0 < (soplex->_realLP->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_3b8 = (long)iVar21;
        lVar22 = 0xf;
        lVar23 = 0;
        do {
          puVar16 = ((local_3d0.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                    lVar22 * 2;
          puVar17 = puVar16 + -0x1e;
          puVar18 = local_a0;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar18 = *puVar17;
            puVar17 = puVar17 + (ulong)bVar26 * -2 + 1;
            puVar18 = puVar18 + (ulong)bVar26 * -2 + 1;
          }
          iVar11 = puVar16[-2];
          bVar3 = *(byte *)(puVar16 + -1);
          uVar1._0_4_ = puVar16[0];
          uVar1._4_4_ = puVar16[1];
          pTVar5 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var6 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          RVar27 = ::soplex::Tolerances::epsilon(pTVar5);
          puVar16 = local_a0;
          pcVar19 = &local_318;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar19->data)._M_elems[0] = *puVar16;
            puVar16 = puVar16 + (ulong)bVar26 * -2 + 1;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar19 + ((ulong)bVar26 * -2 + 1) * 4);
          }
          local_318.neg = (bool)bVar3;
          if ((bVar3 != 0) &&
             (local_318.data._M_elems[0] != 0 || (fpclass_type)uVar1 != cpp_dec_float_finite)) {
            local_318.neg = (bool)(bVar3 ^ 1);
          }
          bVar10 = false;
          local_318.exp = iVar11;
          local_318._120_8_ = uVar1;
          if (((fpclass_type)uVar1 != cpp_dec_float_NaN) && (!NAN(RVar27))) {
            local_330 = 0x1c00000000;
            local_3a8.double_first = 0;
            local_398 = (undefined1  [16])0x0;
            local_388 = (undefined1  [16])0x0;
            local_378 = (undefined1  [16])0x0;
            local_368 = (undefined1  [16])0x0;
            local_358 = (undefined1  [16])0x0;
            local_348 = SUB1613((undefined1  [16])0x0,0);
            uStack_33b = 0;
            uStack_338 = 0;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_3a8.ld,RVar27);
            iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_318,(cpp_dec_float<200U,_int,_void> *)&local_3a8.ld);
            bVar10 = 0 < iVar11;
          }
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
          if ((bVar10) && (VVar15 = (soplex->spxout).m_verbosity, 2 < (int)VVar15)) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar7 = (soplex->spxout).m_streams[3];
            if (colnames->mem == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar7 + -0x18) + (int)poVar7);
            }
            else {
              pcVar24 = colnames->mem +
                        (colnames->set).theitem[(colnames->set).thekey[lVar23].idx].data;
              sVar13 = strlen(pcVar24);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar24,sVar13);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            VVar4 = (soplex->spxout).m_verbosity;
            ppoVar8 = (soplex->spxout).m_streams;
            poVar7 = ppoVar8[VVar4];
            lVar14 = *(long *)poVar7;
            *(long *)(poVar7 + *(long *)(lVar14 + -0x18) + 0x10) = (long)iVar25;
            *(long *)(poVar7 + *(long *)(lVar14 + -0x18) + 8) = local_3b8;
            puVar16 = ((local_3d0.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                      lVar22 * 2 + -0x1e;
            puVar17 = puVar16;
            pnVar20 = &local_190;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pnVar20->m_backend).data._M_elems[0] = *puVar17;
              puVar17 = puVar17 + (ulong)bVar26 * -2 + 1;
              pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
            }
            local_190.m_backend.exp = puVar16[0x1c];
            local_190.m_backend.neg = SUB41(puVar16[0x1d],0);
            local_190.m_backend.fpclass = puVar16[0x1e];
            local_190.m_backend.prec_elem = puVar16[0x1f];
            boost::multiprecision::operator<<(ppoVar8[VVar4],&local_190);
            poVar7 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar9 = (char)poVar7;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + cVar9);
            std::ostream::put(cVar9);
            std::ostream::flush();
            (soplex->spxout).m_verbosity = VVar15;
          }
          lVar23 = lVar23 + 1;
          lVar22 = lVar22 + 0x10;
        } while (lVar23 < (soplex->_realLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      VVar15 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar15) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other entries are zero (within ",0x23);
        poVar7 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar22 = *(long *)poVar7;
        *(undefined8 *)(poVar7 + *(long *)(lVar22 + -0x18) + 8) = 1;
        lVar22 = *(long *)(lVar22 + -0x18);
        *(uint *)(poVar7 + lVar22 + 0x18) = *(uint *)(poVar7 + lVar22 + 0x18) & 0xfffffefb | 0x100;
        pTVar5 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        RVar27 = ::soplex::Tolerances::epsilon(pTVar5);
        std::ostream::_M_insert<double>(RVar27);
        poVar7 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar22 = *(long *)poVar7;
        *(undefined8 *)(poVar7 + *(long *)(lVar22 + -0x18) + 8) = 8;
        lVar22 = *(long *)(lVar22 + -0x18);
        *(uint *)(poVar7 + lVar22 + 0x18) = *(uint *)(poVar7 + lVar22 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,").",2);
        poVar7 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar9 = (char)poVar7;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + cVar9);
        std::ostream::put(cVar9);
        std::ostream::flush();
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        (soplex->spxout).m_verbosity = VVar15;
      }
    }
    else if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0x110 & 1) != 0)) ||
             ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0))))
            && (bVar10 = ::soplex::
                         SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::getPrimal(soplex,&local_3d0), bVar10)) {
      VVar15 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar15) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nPrimal solution (name, value):\n",0x20);
        (soplex->spxout).m_verbosity = VVar15;
      }
      if ((soplex->_realLP->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum < 1) {
        iVar11 = 0;
      }
      else {
        local_3b8 = (long)iVar25;
        local_320 = (long)iVar21;
        lVar23 = 0;
        lVar22 = 0xf;
        iVar11 = 0;
        do {
          puVar16 = ((local_3d0.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                    lVar22 * 2;
          puVar17 = puVar16 + -0x1e;
          puVar18 = local_110;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar18 = *puVar17;
            puVar17 = puVar17 + (ulong)bVar26 * -2 + 1;
            puVar18 = puVar18 + (ulong)bVar26 * -2 + 1;
          }
          iVar12 = puVar16[-2];
          bVar3 = *(byte *)(puVar16 + -1);
          uVar2._0_4_ = puVar16[0];
          uVar2._4_4_ = puVar16[1];
          pTVar5 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var6 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          RVar27 = ::soplex::Tolerances::epsilon(pTVar5);
          puVar16 = local_110;
          pcVar19 = &local_318;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar19->data)._M_elems[0] = *puVar16;
            puVar16 = puVar16 + (ulong)bVar26 * -2 + 1;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar19 + ((ulong)bVar26 * -2 + 1) * 4);
          }
          local_318.neg = (bool)bVar3;
          if ((bVar3 != 0) &&
             (local_318.data._M_elems[0] != 0 || (fpclass_type)uVar2 != cpp_dec_float_finite)) {
            local_318.neg = (bool)(bVar3 ^ 1);
          }
          bVar10 = false;
          local_318.exp = iVar12;
          local_318._120_8_ = uVar2;
          if (((fpclass_type)uVar2 != cpp_dec_float_NaN) && (!NAN(RVar27))) {
            local_330 = 0x1c00000000;
            local_3a8.double_first = 0;
            local_398 = (undefined1  [16])0x0;
            local_388 = (undefined1  [16])0x0;
            local_378 = (undefined1  [16])0x0;
            local_368 = (undefined1  [16])0x0;
            local_358 = (undefined1  [16])0x0;
            local_348 = SUB1613((undefined1  [16])0x0,0);
            uStack_33b = 0;
            uStack_338 = 0;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_3a8.ld,RVar27);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_318,(cpp_dec_float<200U,_int,_void> *)&local_3a8.ld);
            bVar10 = 0 < iVar12;
          }
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
          if (bVar10) {
            VVar15 = (soplex->spxout).m_verbosity;
            if (2 < (int)VVar15) {
              (soplex->spxout).m_verbosity = INFO1;
              poVar7 = (soplex->spxout).m_streams[3];
              if (colnames->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar7 + -0x18) + (int)poVar7);
              }
              else {
                pcVar24 = colnames->mem +
                          (colnames->set).theitem[(colnames->set).thekey[lVar23].idx].data;
                sVar13 = strlen(pcVar24);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar24,sVar13);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              VVar4 = (soplex->spxout).m_verbosity;
              ppoVar8 = (soplex->spxout).m_streams;
              poVar7 = ppoVar8[VVar4];
              lVar14 = *(long *)poVar7;
              *(long *)(poVar7 + *(long *)(lVar14 + -0x18) + 0x10) = local_3b8;
              *(long *)(poVar7 + *(long *)(lVar14 + -0x18) + 8) = local_320;
              puVar16 = ((local_3d0.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                        lVar22 * 2 + -0x1e;
              puVar17 = puVar16;
              pnVar20 = &local_210;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pnVar20->m_backend).data._M_elems[0] = *puVar17;
                puVar17 = puVar17 + (ulong)bVar26 * -2 + 1;
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
              }
              local_210.m_backend.exp = puVar16[0x1c];
              local_210.m_backend.neg = SUB41(puVar16[0x1d],0);
              local_210.m_backend.fpclass = puVar16[0x1e];
              local_210.m_backend.prec_elem = puVar16[0x1f];
              boost::multiprecision::operator<<(ppoVar8[VVar4],&local_210);
              poVar7 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar9 = (char)poVar7;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + cVar9);
              std::ostream::put(cVar9);
              std::ostream::flush();
              (soplex->spxout).m_verbosity = VVar15;
            }
            iVar11 = iVar11 + 1;
          }
          lVar23 = lVar23 + 1;
          lVar22 = lVar22 + 0x10;
        } while (lVar23 < (soplex->_realLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      VVar15 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar15) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other variables are zero (within ",0x25);
        poVar7 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar22 = *(long *)poVar7;
        *(undefined8 *)(poVar7 + *(long *)(lVar22 + -0x18) + 8) = 1;
        lVar22 = *(long *)(lVar22 + -0x18);
        *(uint *)(poVar7 + lVar22 + 0x18) = *(uint *)(poVar7 + lVar22 + 0x18) & 0xfffffefb | 0x100;
        pTVar5 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        RVar27 = ::soplex::Tolerances::epsilon(pTVar5);
        std::ostream::_M_insert<double>(RVar27);
        poVar7 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar22 = *(long *)poVar7;
        *(undefined8 *)(poVar7 + *(long *)(lVar22 + -0x18) + 8) = 8;
        lVar22 = *(long *)(lVar22 + -0x18);
        *(uint *)(poVar7 + lVar22 + 0x18) = *(uint *)(poVar7 + lVar22 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"). Solution has ",0x10);
        std::ostream::operator<<
                  ((ostream *)(soplex->spxout).m_streams[(soplex->spxout).m_verbosity],iVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity]," nonzero entries.",0x11
                  );
        poVar7 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar9 = (char)poVar7;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + cVar9);
        std::ostream::put(cVar9);
        std::ostream::flush();
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
        (soplex->spxout).m_verbosity = VVar15;
      }
    }
    else {
      VVar15 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar15) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No primal information available.\n",0x21);
        (soplex->spxout).m_verbosity = VVar15;
      }
    }
    if (local_3d0.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3d0.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_3d0.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3d0.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((char)local_3b0 == '\0') {
    return;
  }
  ::soplex::
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_318,
               (soplex->_realLP->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  bVar10 = ::soplex::
           SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::getPrimalRayRational
                     (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                              *)&local_318);
  if (bVar10) {
    VVar15 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar15) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"\nPrimal ray (name, value):\n",0x1b);
      (soplex->spxout).m_verbosity = VVar15;
    }
    if (0 < (soplex->_realLP->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      local_3b0 = (long)iVar25;
      lVar22 = 0;
      lVar23 = 0;
      do {
        lVar14 = CONCAT44(local_318.data._M_elems[1],local_318.data._M_elems[0]);
        local_3d0.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_3a8.ld,(longlong *)&local_3d0,(type *)0x0);
        iVar25 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)(lVar14 + lVar22),
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_3a8.ld);
        if ((local_378[5] == '\0') && (local_378[6] == '\0')) {
          operator_delete((void *)local_388._8_8_,(ulong)(uint)local_388._0_4_ << 3);
        }
        if ((local_398[5] == '\0') && (local_398[6] == '\0')) {
          operator_delete(local_3a8.ld.data,(ulong)local_3a8.ld.capacity << 3);
        }
        if ((iVar25 != 0) && (VVar15 = (soplex->spxout).m_verbosity, 2 < (int)VVar15)) {
          (soplex->spxout).m_verbosity = INFO1;
          poVar7 = (soplex->spxout).m_streams[3];
          if (colnames->mem == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(*(long *)poVar7 + -0x18) + (int)poVar7);
          }
          else {
            pcVar24 = colnames->mem +
                      (colnames->set).theitem[(colnames->set).thekey[lVar23].idx].data;
            sVar13 = strlen(pcVar24);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar24,sVar13);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
          poVar7 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          lVar14 = *(long *)poVar7;
          *(long *)(poVar7 + *(long *)(lVar14 + -0x18) + 0x10) = local_3b0;
          *(long *)(poVar7 + *(long *)(lVar14 + -0x18) + 8) = (long)iVar21;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_258.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)(CONCAT44(local_318.data._M_elems[1],local_318.data._M_elems[0]) +
                                lVar22));
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_258.ld);
          poVar7 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          cVar9 = (char)poVar7;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + cVar9);
          std::ostream::put(cVar9);
          std::ostream::flush();
          if ((local_223 == '\0') && (local_222 == '\0')) {
            operator_delete(local_230,(ulong)local_238 << 3);
          }
          if ((local_243 == '\0') && (local_242 == '\0')) {
            operator_delete(local_258.ld.data,(ulong)local_258.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar15;
        }
        lVar23 = lVar23 + 1;
        lVar22 = lVar22 + 0x40;
      } while (lVar23 < (soplex->_realLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
    VVar15 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar15) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"All other entries are zero.",0x1b);
      poVar7 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      cVar9 = (char)poVar7;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + cVar9);
      std::ostream::put(cVar9);
      std::ostream::flush();
      (soplex->spxout).m_verbosity = VVar15;
    }
  }
  if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0x110 & 1) != 0)) ||
      ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0)))) &&
     (bVar10 = ::soplex::
               SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::getPrimalRational(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                           *)&local_318), bVar10)) {
    VVar15 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar15) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"\nPrimal solution (name, value):\n",0x20);
      (soplex->spxout).m_verbosity = VVar15;
    }
    if ((soplex->_rationalLP->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .set.thenum < 1) {
      iVar21 = 0;
    }
    else {
      lVar22 = 0;
      lVar23 = 0;
      iVar21 = 0;
      do {
        lVar14 = CONCAT44(local_318.data._M_elems[1],local_318.data._M_elems[0]);
        local_3d0.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_3a8.ld,(longlong *)&local_3d0,(type *)0x0);
        iVar25 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)(lVar14 + lVar22),
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_3a8.ld);
        if ((local_378[5] == '\0') && (local_378[6] == '\0')) {
          operator_delete((void *)local_388._8_8_,(ulong)(uint)local_388._0_4_ << 3);
        }
        if ((local_398[5] == '\0') && (local_398[6] == '\0')) {
          operator_delete(local_3a8.ld.data,(ulong)local_3a8.ld.capacity << 3);
        }
        if (iVar25 != 0) {
          VVar15 = (soplex->spxout).m_verbosity;
          if (2 < (int)VVar15) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar7 = (soplex->spxout).m_streams[3];
            if (colnames->mem == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar7 + -0x18) + (int)poVar7);
            }
            else {
              pcVar24 = colnames->mem +
                        (colnames->set).theitem[(colnames->set).thekey[lVar23].idx].data;
              sVar13 = strlen(pcVar24);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar24,sVar13);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_298.ld,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)(CONCAT44(local_318.data._M_elems[1],local_318.data._M_elems[0]) +
                                  lVar22));
            boost::multiprecision::operator<<
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                       (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_298.ld);
            poVar7 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar9 = (char)poVar7;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + cVar9);
            std::ostream::put(cVar9);
            std::ostream::flush();
            if ((local_263 == '\0') && (local_262 == '\0')) {
              operator_delete(local_270,(ulong)local_278 << 3);
            }
            if ((local_283 == '\0') && (local_282 == '\0')) {
              operator_delete(local_298.ld.data,(ulong)local_298.ld.capacity << 3);
            }
            (soplex->spxout).m_verbosity = VVar15;
          }
          iVar21 = iVar21 + 1;
        }
        lVar23 = lVar23 + 1;
        lVar22 = lVar22 + 0x40;
      } while (lVar23 < (soplex->_rationalLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        .set.thenum);
    }
    VVar15 = (soplex->spxout).m_verbosity;
    if ((int)VVar15 < 3) goto LAB_00144cc9;
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((soplex->spxout).m_streams[3],"All other variables are zero. Solution has ",0x2b);
    std::ostream::operator<<
              ((ostream *)(soplex->spxout).m_streams[(soplex->spxout).m_verbosity],iVar21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity]," nonzero entries.",0x11);
    poVar7 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
    cVar9 = (char)poVar7;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + cVar9);
    std::ostream::put(cVar9);
    std::ostream::flush();
  }
  else {
    VVar15 = (soplex->spxout).m_verbosity;
    if ((int)VVar15 < 3) goto LAB_00144cc9;
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((soplex->spxout).m_streams[3],"No primal (rational) solution available.\n",0x29);
  }
  (soplex->spxout).m_verbosity = VVar15;
LAB_00144cc9:
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
             *)&local_318);
  return;
}

Assistant:

static
void printPrimalSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                         bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << ")." << std::endl;)
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal information available.\n")
      }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero. Solution has "
                       << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal (rational) solution available.\n")

      }
}